

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_2.h
# Opt level: O1

bool __thiscall
dlib::
binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_hook_container,_std::default_delete<dlib::logger::global_data::output_hook_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::remove_least_element_in_tree
          (binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_hook_container,_std::default_delete<dlib::logger::global_data::output_hook_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,node *t,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *d,
          unique_ptr<dlib::logger::global_data::output_hook_container,_std::default_delete<dlib::logger::global_data::output_hook_container>_>
          *r)

{
  output_hook_container *poVar1;
  node *pnVar2;
  
  pnVar2 = t->left;
  if (t->left == this->NIL) {
    pnVar2 = t->right;
    (&t->parent->left)[t->parent->left != t] = pnVar2;
    if (this->tree_root == t) {
      this->tree_root = pnVar2;
    }
  }
  else {
    do {
      t = pnVar2;
      pnVar2 = t->left;
    } while (t->left != this->NIL);
    pnVar2 = t->right;
    t->parent->left = pnVar2;
  }
  std::__cxx11::string::swap((string *)d);
  poVar1 = (r->_M_t).
           super___uniq_ptr_impl<dlib::logger::global_data::output_hook_container,_std::default_delete<dlib::logger::global_data::output_hook_container>_>
           ._M_t.
           super__Tuple_impl<0UL,_dlib::logger::global_data::output_hook_container_*,_std::default_delete<dlib::logger::global_data::output_hook_container>_>
           .super__Head_base<0UL,_dlib::logger::global_data::output_hook_container_*,_false>.
           _M_head_impl;
  (r->_M_t).
  super___uniq_ptr_impl<dlib::logger::global_data::output_hook_container,_std::default_delete<dlib::logger::global_data::output_hook_container>_>
  ._M_t.
  super__Tuple_impl<0UL,_dlib::logger::global_data::output_hook_container_*,_std::default_delete<dlib::logger::global_data::output_hook_container>_>
  .super__Head_base<0UL,_dlib::logger::global_data::output_hook_container_*,_false>._M_head_impl =
       (t->r)._M_t.
       super___uniq_ptr_impl<dlib::logger::global_data::output_hook_container,_std::default_delete<dlib::logger::global_data::output_hook_container>_>
       ._M_t.
       super__Tuple_impl<0UL,_dlib::logger::global_data::output_hook_container_*,_std::default_delete<dlib::logger::global_data::output_hook_container>_>
       .super__Head_base<0UL,_dlib::logger::global_data::output_hook_container_*,_false>.
       _M_head_impl;
  (t->r)._M_t.
  super___uniq_ptr_impl<dlib::logger::global_data::output_hook_container,_std::default_delete<dlib::logger::global_data::output_hook_container>_>
  ._M_t.
  super__Tuple_impl<0UL,_dlib::logger::global_data::output_hook_container_*,_std::default_delete<dlib::logger::global_data::output_hook_container>_>
  .super__Head_base<0UL,_dlib::logger::global_data::output_hook_container_*,_false>._M_head_impl =
       poVar1;
  pnVar2->parent = t->parent;
  if (t->color == '\x01') {
    fix_after_remove(this,pnVar2);
  }
  pnVar2 = this->current_element;
  memory_manager_stateless_kernel_1<dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_hook_container,_std::default_delete<dlib::logger::global_data::output_hook_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::node>
  ::deallocate(&this->pool,t);
  return t == pnVar2;
}

Assistant:

bool binary_search_tree_kernel_2<domain,range,mem_manager,compare>::
    remove_least_element_in_tree (
        node* t,
        domain& d,
        range& r
    ) 
    {

        node* next = t->left;
        node* child;  // the child node of the one we will slice out

        if (next == NIL)
        {
            // need to determine if t is a left or right child
            if (t->parent->left == t)
                child = t->parent->left = t->right;
            else
                child = t->parent->right = t->right;

            // update tree_root if necessary
            if (t == tree_root)
                tree_root = child;
        }
        else
        {
            // find the least node
            do 
            {
                t = next;
                next = next->left;
            } while (next != NIL);
            // t is a left child
            child = t->parent->left = t->right;

        }
        
        // swap the item from this node into d and r
        exchange(d,t->d);
        exchange(r,t->r);

        // plug hole left by removing this node
        child->parent = t->parent;

        // keep the red-black properties true
        if (t->color == black)
            fix_after_remove(child);

        bool rvalue = (t == current_element);
        // free the memory for this removed node
        pool.deallocate(t);        
        return rvalue;
    }